

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O0

void wabt::interp::WriteValue(Stream *stream,TypedValue *tv)

{
  void *src;
  size_t size;
  TypedValue *in_RDX;
  undefined1 local_38 [8];
  string s;
  TypedValue *tv_local;
  Stream *stream_local;
  
  s.field_2._8_8_ = tv;
  TypedValueToString_abi_cxx11_((string *)local_38,(interp *)tv,in_RDX);
  src = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  Stream::WriteData(stream,src,size,(char *)0x0,No);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void WriteValue(Stream* stream, const TypedValue& tv) {
  std::string s = TypedValueToString(tv);
  stream->WriteData(s.data(), s.size());
}